

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O2

bool __thiscall pm::Rectangle::hit(Rectangle *this,Ray *ray,float *tMin,ShadeRecord *sr)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar9 = (this->point_).x;
  fVar10 = (ray->o).x;
  fVar11 = (this->point_).y;
  fVar12 = (ray->o).y;
  fVar13 = (this->point_).z;
  fVar14 = (ray->o).z;
  fVar15 = (this->normal_).y;
  fVar1 = (this->normal_).x;
  fVar2 = (this->normal_).z;
  fVar8 = dot(&ray->d,&this->normal_);
  fVar8 = ((fVar13 - fVar14) * fVar2 + (fVar9 - fVar10) * fVar1 + (fVar11 - fVar12) * fVar15) /
          fVar8;
  if (fVar8 <= 1e-09) {
    bVar7 = false;
  }
  else {
    uVar3 = (ray->o).x;
    uVar5 = (ray->o).y;
    uVar4 = (ray->d).x;
    uVar6 = (ray->d).y;
    fVar10 = fVar8 * (float)uVar4 + (float)uVar3;
    fVar11 = fVar8 * (float)uVar6 + (float)uVar5;
    fVar9 = (ray->d).z * fVar8 + (ray->o).z;
    fVar12 = fVar11 - (this->point_).y;
    fVar14 = fVar10 - (this->point_).x;
    fVar13 = fVar9 - (this->point_).z;
    fVar15 = (this->a_).z * fVar13 + (this->a_).x * fVar14 + (this->a_).y * fVar12;
    bVar7 = false;
    if ((0.0 <= fVar15) &&
       (bVar7 = false, fVar15 < this->aSquaredLength_ || fVar15 == this->aSquaredLength_)) {
      fVar12 = fVar13 * (this->b_).z + fVar14 * (this->b_).x + fVar12 * (this->b_).y;
      bVar7 = false;
      if ((0.0 <= fVar12) && (fVar12 < this->bSquaredLength_ || fVar12 == this->bSquaredLength_)) {
        *tMin = fVar8;
        fVar12 = (this->normal_).y;
        (sr->normal).x = (this->normal_).x;
        (sr->normal).y = fVar12;
        (sr->normal).z = (this->normal_).z;
        (sr->localHitPoint).x = fVar10;
        (sr->localHitPoint).y = fVar11;
        (sr->localHitPoint).z = fVar9;
        bVar7 = true;
      }
    }
  }
  return bVar7;
}

Assistant:

bool Rectangle::hit(const Ray &ray, float &tMin, ShadeRecord &sr) const
{
	float t = dot((point_ - ray.o), normal_) / dot(ray.d, normal_);

	if (t <= Epsilon)
		return false;

	Vector3 p = ray.o + t * ray.d;
	Vector3 d = p - point_;

	const float dDotA = dot(d, a_);
	if (dDotA < 0.0f || dDotA > aSquaredLength_)
		return false;

	const float dDotB = dot(d, b_);
	if (dDotB < 0.0f || dDotB > bSquaredLength_)
		return false;

	tMin = t;
	sr.normal = normal_;
	sr.localHitPoint = p;

	return true;
}